

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall
QDockAreaLayout::getGrid
          (QDockAreaLayout *this,QList<QLayoutStruct> *_ver_struct_list,
          QList<QLayoutStruct> *_hor_struct_list)

{
  QDockAreaLayoutInfo *this_00;
  QDockAreaLayoutInfo *this_01;
  QDockAreaLayoutInfo *this_02;
  QDockAreaLayoutInfo *this_03;
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Representation extraout_var;
  uint extraout_var_00;
  int extraout_var_01;
  QSize QVar10;
  QSize QVar11;
  QSize QVar12;
  QSize QVar13;
  QSize QVar14;
  QSize QVar15;
  QSize QVar16;
  QSize QVar17;
  QSize QVar18;
  QSize QVar19;
  QSize QVar20;
  pointer pQVar21;
  pointer pQVar22;
  Representation RVar23;
  Representation RVar24;
  Representation RVar25;
  Representation RVar26;
  Representation RVar27;
  QList<QLayoutStruct> *hor_struct_list;
  int iVar28;
  Representation RVar29;
  uint uVar30;
  Representation RVar31;
  Representation RVar32;
  int iVar33;
  QSize QVar34;
  QList<QLayoutStruct> *ver_struct_list;
  Representation RVar35;
  uint uVar36;
  Representation RVar37;
  long lVar38;
  bool local_140;
  bool local_13c;
  int local_130;
  int local_12c;
  uint local_128;
  QSize local_120;
  
  local_140 = true;
  if (this->centralWidgetItem == (QLayoutItem *)0x0) {
    local_13c = false;
    iVar9 = 0;
    iVar33 = 0;
    iVar8 = 0;
    uVar36 = 0;
    local_120.wd.m_i = 0;
    local_120.ht.m_i = 0;
    local_128 = 0;
  }
  else {
    iVar7 = (*this->centralWidgetItem->_vptr_QLayoutItem[8])();
    local_13c = false;
    iVar9 = 0;
    iVar33 = 0;
    iVar8 = 0;
    uVar36 = 0;
    local_120.wd.m_i = 0;
    local_120.ht.m_i = 0;
    local_128 = 0;
    if ((char)iVar7 == '\0') {
      local_120 = QRect::size(&this->centralWidgetRect);
      if (((ulong)local_120 & 0x8000000080000000) != 0) {
        local_120.wd.m_i = (*this->centralWidgetItem->_vptr_QLayoutItem[2])();
        local_120.ht.m_i = extraout_var.m_i;
      }
      local_128 = (uint)local_120.ht.m_i;
      iVar8 = (*this->centralWidgetItem->_vptr_QLayoutItem[3])();
      iVar9 = (*this->centralWidgetItem->_vptr_QLayoutItem[4])();
      local_13c = true;
      local_140 = false;
      uVar36 = extraout_var_00;
      iVar33 = extraout_var_01;
    }
  }
  iVar7 = (this->rect).x1.m_i;
  local_130 = (this->rect).y1.m_i;
  iVar28 = (this->rect).x2.m_i;
  local_12c = (this->rect).y2.m_i;
  this_00 = this->docks;
  bVar3 = QDockAreaLayoutInfo::isEmpty(this_00);
  if (!bVar3) {
    iVar7 = (((this->rect).x1.m_i + this->docks[0].rect.x2.m_i) - this->docks[0].rect.x1.m_i) +
            this->sep + 1;
  }
  this_01 = this->docks + 2;
  bVar3 = QDockAreaLayoutInfo::isEmpty(this_01);
  if (!bVar3) {
    local_130 = (((this->rect).y1.m_i + this->docks[2].rect.y2.m_i) - this->docks[2].rect.y1.m_i) +
                this->sep + 1;
  }
  this_02 = this->docks + 1;
  bVar3 = QDockAreaLayoutInfo::isEmpty(this_02);
  if (!bVar3) {
    iVar28 = (~this->docks[1].rect.x2.m_i + (this->rect).x2.m_i + this->docks[1].rect.x1.m_i) -
             this->sep;
  }
  this_03 = this->docks + 3;
  bVar3 = QDockAreaLayoutInfo::isEmpty(this_03);
  if (!bVar3) {
    local_12c = (~this->docks[3].rect.y2.m_i + (this->rect).y2.m_i + this->docks[3].rect.y1.m_i) -
                this->sep;
  }
  QVar10 = QDockAreaLayoutInfo::size(this_00);
  if (((ulong)QVar10 >> 0x20 == 0 && QVar10.wd.m_i.m_i == 0) || (this->fallbackToSizeHints == true))
  {
    QVar10 = QDockAreaLayoutInfo::sizeHint(this_00);
  }
  QVar11 = QDockAreaLayoutInfo::minimumSize(this_00);
  RVar27 = QVar11.ht.m_i;
  QVar12 = QDockAreaLayoutInfo::maximumSize(this_00);
  QVar13 = QVar10;
  if (QVar12.wd.m_i.m_i <= QVar10.wd.m_i.m_i) {
    QVar13 = QVar12;
  }
  RVar23.m_i = QVar12.ht.m_i.m_i;
  if (QVar10.ht.m_i.m_i < QVar12.ht.m_i.m_i) {
    RVar23.m_i = QVar10.ht.m_i.m_i;
  }
  if (QVar13.wd.m_i.m_i <= QVar11.wd.m_i.m_i) {
    QVar13 = QVar11;
  }
  if (RVar23.m_i <= RVar27.m_i) {
    RVar23.m_i = RVar27.m_i;
  }
  QVar10 = QDockAreaLayoutInfo::size(this_02);
  if (((ulong)QVar10 >> 0x20 == 0 && QVar10.wd.m_i.m_i == 0) ||
     (QVar14 = QVar10, this->fallbackToSizeHints == true)) {
    QVar14 = QDockAreaLayoutInfo::sizeHint(this_02);
    QVar10 = (QSize)((ulong)QVar14 & 0xffffffff);
  }
  QVar15 = QDockAreaLayoutInfo::minimumSize(this_02);
  RVar32 = QVar15.ht.m_i;
  QVar16 = QDockAreaLayoutInfo::maximumSize(this_02);
  if (QVar16.wd.m_i.m_i <= QVar10.wd.m_i.m_i) {
    QVar10 = QVar16;
  }
  RVar24.m_i = QVar16.ht.m_i.m_i;
  if (QVar14.ht.m_i.m_i < QVar16.ht.m_i.m_i) {
    RVar24.m_i = QVar14.ht.m_i.m_i;
  }
  if (QVar10.wd.m_i.m_i <= QVar15.wd.m_i.m_i) {
    QVar10 = QVar15;
  }
  if (RVar24.m_i <= RVar32.m_i) {
    RVar24.m_i = RVar32.m_i;
  }
  QVar14 = QDockAreaLayoutInfo::size(this_01);
  if (((ulong)QVar14 >> 0x20 == 0 && QVar14.wd.m_i.m_i == 0) ||
     (QVar34 = QVar14, this->fallbackToSizeHints == true)) {
    QVar14 = QDockAreaLayoutInfo::sizeHint(this_01);
    QVar34 = (QSize)((ulong)QVar14 & 0xffffffff);
  }
  QVar17 = QDockAreaLayoutInfo::minimumSize(this_01);
  RVar35 = QVar17.ht.m_i;
  QVar18 = QDockAreaLayoutInfo::maximumSize(this_01);
  if (QVar18.wd.m_i.m_i <= QVar34.wd.m_i.m_i) {
    QVar34 = QVar18;
  }
  RVar25 = QVar18.ht.m_i;
  RVar29.m_i = QVar14.ht.m_i.m_i;
  if (RVar25.m_i <= QVar14.ht.m_i.m_i) {
    RVar29.m_i = RVar25.m_i;
  }
  if (QVar34.wd.m_i.m_i <= QVar17.wd.m_i.m_i) {
    QVar34 = QVar17;
  }
  if (RVar29.m_i <= RVar35.m_i) {
    RVar29.m_i = RVar35.m_i;
  }
  QVar14 = QDockAreaLayoutInfo::size(this_03);
  if (((ulong)QVar14 >> 0x20 == 0 && QVar14.wd.m_i.m_i == 0) ||
     (QVar18 = QVar14, this->fallbackToSizeHints == true)) {
    QVar18 = QDockAreaLayoutInfo::sizeHint(this_03);
    QVar14 = (QSize)((ulong)QVar18 & 0xffffffff);
  }
  QVar19 = QDockAreaLayoutInfo::minimumSize(this_03);
  RVar31 = QVar19.ht.m_i;
  QVar20 = QDockAreaLayoutInfo::maximumSize(this_03);
  if (QVar20.wd.m_i.m_i <= QVar14.wd.m_i.m_i) {
    QVar14 = QVar20;
  }
  RVar26 = QVar20.ht.m_i;
  RVar37.m_i = QVar18.ht.m_i.m_i;
  if (RVar26.m_i <= QVar18.ht.m_i.m_i) {
    RVar37.m_i = RVar26.m_i;
  }
  if (QVar14.wd.m_i.m_i <= QVar19.wd.m_i.m_i) {
    QVar14 = QVar19;
  }
  if (RVar37.m_i <= RVar31.m_i) {
    RVar37.m_i = RVar31.m_i;
  }
  if (_ver_struct_list != (QList<QLayoutStruct> *)0x0) {
    QList<QLayoutStruct>::resize(_ver_struct_list,3);
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->stretch = 0;
    pQVar21->sizeHint = 0;
    pQVar21->maximumSize = 0x7ffff;
    pQVar21->minimumSize = 0;
    pQVar21->expansive = false;
    pQVar21->empty = true;
    pQVar21->spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->stretch = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->sizeHint = RVar29.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->minimumSize = RVar35.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->maximumSize = RVar25.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->expansive = false;
    bVar3 = QDockAreaLayoutInfo::isEmpty(this_01);
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->empty = bVar3;
    iVar1 = this->docks[2].rect.y1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->pos = iVar1;
    iVar1 = this->docks[2].rect.y2.m_i;
    iVar2 = this->docks[2].rect.y1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21->size = (iVar1 - iVar2) + 1;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].stretch = 0;
    pQVar21[1].sizeHint = 0;
    pQVar21[1].maximumSize = 0x7ffff;
    pQVar21[1].minimumSize = 0;
    pQVar21[1].expansive = false;
    pQVar21[1].empty = true;
    pQVar21[1].spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].stretch = local_128;
    if (this->corners[0] == TopDockWidgetArea) {
      bVar3 = false;
    }
    else {
      bVar3 = QDockAreaLayoutInfo::isEmpty(this_01);
      bVar3 = !bVar3;
    }
    if (this->corners[2] == BottomDockWidgetArea) {
      bVar5 = false;
    }
    else {
      bVar5 = QDockAreaLayoutInfo::isEmpty(this_03);
      bVar5 = !bVar5;
    }
    if (this->corners[1] == TopDockWidgetArea) {
      bVar6 = false;
    }
    else {
      bVar6 = QDockAreaLayoutInfo::isEmpty(this_01);
      bVar6 = !bVar6;
    }
    uVar30 = 0;
    bVar4 = false;
    if (this->corners[3] != BottomDockWidgetArea) {
      bVar4 = QDockAreaLayoutInfo::isEmpty(this_03);
      bVar4 = !bVar4;
    }
    if (bVar6 || bVar4) {
      RVar32.m_i = uVar30;
      RVar24.m_i = uVar30;
    }
    if (RVar24.m_i < (int)local_128) {
      RVar24.m_i = local_128;
    }
    if (bVar3 || bVar5) {
      RVar27.m_i = uVar30;
      RVar23.m_i = uVar30;
    }
    if (RVar23.m_i < RVar24.m_i) {
      RVar23.m_i = RVar24.m_i;
    }
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    if (RVar32.m_i < (int)uVar36) {
      RVar32.m_i = uVar36;
    }
    pQVar21[1].sizeHint = RVar23.m_i;
    if (RVar32.m_i <= RVar27.m_i) {
      RVar32.m_i = RVar27.m_i;
    }
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].minimumSize = RVar32.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].maximumSize = iVar33;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].expansive = local_13c;
    bVar3 = QDockAreaLayoutInfo::isEmpty(this_00);
    if ((bVar3 & local_140) == 1) {
      bVar3 = QDockAreaLayoutInfo::isEmpty(this_02);
      uVar30 = (uint)bVar3;
    }
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].empty = SUB41(uVar30,0);
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].pos = local_130;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[1].size = (local_12c - local_130) + 1;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].stretch = 0;
    pQVar21[2].sizeHint = 0;
    pQVar21[2].maximumSize = 0x7ffff;
    pQVar21[2].minimumSize = 0;
    pQVar21[2].expansive = false;
    pQVar21[2].empty = true;
    pQVar21[2].spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].stretch = 0;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].sizeHint = RVar37.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].minimumSize = RVar31.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].maximumSize = RVar26.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].expansive = false;
    bVar3 = QDockAreaLayoutInfo::isEmpty(this_03);
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].empty = bVar3;
    iVar33 = this->docks[3].rect.y1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].pos = iVar33;
    iVar33 = this->docks[3].rect.y2.m_i;
    iVar1 = this->docks[3].rect.y1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
    pQVar21[2].size = (iVar33 - iVar1) + 1;
    for (lVar38 = 0; lVar38 != 0x60; lVar38 = lVar38 + 0x20) {
      pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
      pQVar22 = QList<QLayoutStruct>::data(_ver_struct_list);
      iVar33 = *(int *)((long)&pQVar21->sizeHint + lVar38);
      iVar1 = *(int *)((long)&pQVar22->minimumSize + lVar38);
      if (iVar1 < iVar33) {
        iVar1 = iVar33;
      }
      pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
      *(int *)((long)&pQVar21->sizeHint + lVar38) = iVar1;
    }
    if (((local_140 == false) &&
        (pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list), pQVar21->empty == true)) &&
       (pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list), pQVar21[2].empty == true)) {
      pQVar21 = QList<QLayoutStruct>::data(_ver_struct_list);
      pQVar21[1].maximumSize = 0xffffff;
    }
  }
  if (_hor_struct_list != (QList<QLayoutStruct> *)0x0) {
    QList<QLayoutStruct>::resize(_hor_struct_list,3);
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->stretch = 0;
    pQVar21->sizeHint = 0;
    pQVar21->maximumSize = 0x7ffff;
    pQVar21->minimumSize = 0;
    pQVar21->expansive = false;
    pQVar21->empty = true;
    pQVar21->spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->stretch = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->sizeHint = QVar13.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->minimumSize = QVar11.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->maximumSize = QVar12.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->expansive = false;
    bVar3 = QDockAreaLayoutInfo::isEmpty(this_00);
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->empty = bVar3;
    iVar33 = this->docks[0].rect.x1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->pos = iVar33;
    iVar33 = this->docks[0].rect.x2.m_i;
    iVar1 = this->docks[0].rect.x1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21->size = (iVar33 - iVar1) + 1;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].stretch = 0;
    pQVar21[1].sizeHint = 0;
    pQVar21[1].maximumSize = 0x7ffff;
    pQVar21[1].minimumSize = 0;
    pQVar21[1].expansive = false;
    pQVar21[1].empty = true;
    pQVar21[1].spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    RVar27 = local_120.wd.m_i;
    pQVar21[1].stretch = RVar27.m_i;
    if (this->corners[0] == LeftDockWidgetArea) {
      bVar3 = false;
    }
    else {
      bVar3 = QDockAreaLayoutInfo::isEmpty(this_00);
      bVar3 = !bVar3;
    }
    if (this->corners[1] == RightDockWidgetArea) {
      bVar5 = false;
    }
    else {
      bVar5 = QDockAreaLayoutInfo::isEmpty(this_02);
      bVar5 = !bVar5;
    }
    if (this->corners[2] == LeftDockWidgetArea) {
      bVar6 = false;
    }
    else {
      bVar6 = QDockAreaLayoutInfo::isEmpty(this_00);
      bVar6 = !bVar6;
    }
    lVar38 = 0;
    iVar33 = 0;
    bVar4 = false;
    if (this->corners[3] != RightDockWidgetArea) {
      bVar4 = QDockAreaLayoutInfo::isEmpty(this_02);
      bVar4 = !bVar4;
    }
    RVar23.m_i = QVar19.wd.m_i.m_i;
    RVar32.m_i = QVar14.wd.m_i.m_i;
    if (bVar6 || bVar4) {
      RVar23.m_i = iVar33;
      RVar32.m_i = iVar33;
    }
    if (RVar32.m_i < RVar27.m_i) {
      RVar32.m_i = RVar27.m_i;
    }
    RVar24.m_i = QVar17.wd.m_i.m_i;
    RVar27.m_i = QVar34.wd.m_i.m_i;
    if (bVar3 || bVar5) {
      RVar24.m_i = iVar33;
      RVar27.m_i = iVar33;
    }
    if (RVar27.m_i < RVar32.m_i) {
      RVar27.m_i = RVar32.m_i;
    }
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    if (RVar23.m_i < iVar8) {
      RVar23.m_i = iVar8;
    }
    pQVar21[1].sizeHint = RVar27.m_i;
    if (RVar23.m_i <= RVar24.m_i) {
      RVar23.m_i = RVar24.m_i;
    }
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].minimumSize = RVar23.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].maximumSize = iVar9;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].expansive = local_13c;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].empty = local_140;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].pos = iVar7;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[1].size = (iVar28 - iVar7) + 1;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].stretch = 0;
    pQVar21[2].sizeHint = 0;
    pQVar21[2].maximumSize = 0x7ffff;
    pQVar21[2].minimumSize = 0;
    pQVar21[2].expansive = false;
    pQVar21[2].empty = true;
    pQVar21[2].spacing = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].stretch = 0;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].sizeHint = QVar10.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].minimumSize = QVar15.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].maximumSize = QVar16.wd.m_i.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].expansive = false;
    bVar3 = QDockAreaLayoutInfo::isEmpty(this_02);
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].empty = bVar3;
    iVar33 = this->docks[1].rect.x1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].pos = iVar33;
    iVar33 = this->docks[1].rect.x2.m_i;
    iVar8 = this->docks[1].rect.x1.m_i;
    pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
    pQVar21[2].size = (iVar33 - iVar8) + 1;
    for (; lVar38 != 0x60; lVar38 = lVar38 + 0x20) {
      pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
      pQVar22 = QList<QLayoutStruct>::data(_hor_struct_list);
      iVar33 = *(int *)((long)&pQVar21->sizeHint + lVar38);
      iVar8 = *(int *)((long)&pQVar22->minimumSize + lVar38);
      if (iVar8 < iVar33) {
        iVar8 = iVar33;
      }
      pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
      *(int *)((long)&pQVar21->sizeHint + lVar38) = iVar8;
    }
    if (((local_140 == false) &&
        (pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list), pQVar21->empty == true)) &&
       (pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list), pQVar21[2].empty == true)) {
      pQVar21 = QList<QLayoutStruct>::data(_hor_struct_list);
      pQVar21[1].maximumSize = 0xffffff;
    }
  }
  return;
}

Assistant:

void QDockAreaLayout::getGrid(QList<QLayoutStruct> *_ver_struct_list,
                              QList<QLayoutStruct> *_hor_struct_list)
{
    QSize center_hint(0, 0);
    QSize center_min(0, 0);
    QSize center_max(0, 0);
    const bool have_central = centralWidgetItem != nullptr && !centralWidgetItem->isEmpty();
    if (have_central) {
        center_hint = centralWidgetRect.size();
        if (!center_hint.isValid())
            center_hint = centralWidgetItem->sizeHint();
        center_min = centralWidgetItem->minimumSize();
        center_max = centralWidgetItem->maximumSize();
    }

    QRect center_rect = rect;
    if (!docks[QInternal::LeftDock].isEmpty())
        center_rect.setLeft(rect.left() + docks[QInternal::LeftDock].rect.width() + sep);
    if (!docks[QInternal::TopDock].isEmpty())
        center_rect.setTop(rect.top() + docks[QInternal::TopDock].rect.height() + sep);
    if (!docks[QInternal::RightDock].isEmpty())
        center_rect.setRight(rect.right() - docks[QInternal::RightDock].rect.width() - sep);
    if (!docks[QInternal::BottomDock].isEmpty())
        center_rect.setBottom(rect.bottom() - docks[QInternal::BottomDock].rect.height() - sep);

    QSize left_hint = docks[QInternal::LeftDock].size();
    if (left_hint.isNull() || fallbackToSizeHints)
        left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize left_min = docks[QInternal::LeftDock].minimumSize();
    QSize left_max = docks[QInternal::LeftDock].maximumSize();
    left_hint = left_hint.boundedTo(left_max).expandedTo(left_min);

    QSize right_hint = docks[QInternal::RightDock].size();
    if (right_hint.isNull() || fallbackToSizeHints)
        right_hint = docks[QInternal::RightDock].sizeHint();
    QSize right_min = docks[QInternal::RightDock].minimumSize();
    QSize right_max = docks[QInternal::RightDock].maximumSize();
    right_hint = right_hint.boundedTo(right_max).expandedTo(right_min);

    QSize top_hint = docks[QInternal::TopDock].size();
    if (top_hint.isNull() || fallbackToSizeHints)
        top_hint = docks[QInternal::TopDock].sizeHint();
    QSize top_min = docks[QInternal::TopDock].minimumSize();
    QSize top_max = docks[QInternal::TopDock].maximumSize();
    top_hint = top_hint.boundedTo(top_max).expandedTo(top_min);

    QSize bottom_hint = docks[QInternal::BottomDock].size();
    if (bottom_hint.isNull() || fallbackToSizeHints)
        bottom_hint = docks[QInternal::BottomDock].sizeHint();
    QSize bottom_min = docks[QInternal::BottomDock].minimumSize();
    QSize bottom_max = docks[QInternal::BottomDock].maximumSize();
    bottom_hint = bottom_hint.boundedTo(bottom_max).expandedTo(bottom_min);

    if (_ver_struct_list != nullptr) {
        QList<QLayoutStruct> &ver_struct_list = *_ver_struct_list;
        ver_struct_list.resize(3);

        // top --------------------------------------------------
        ver_struct_list[0].init();
        ver_struct_list[0].stretch = 0;
        ver_struct_list[0].sizeHint = top_hint.height();
        ver_struct_list[0].minimumSize = top_min.height();
        ver_struct_list[0].maximumSize = top_max.height();
        ver_struct_list[0].expansive = false;
        ver_struct_list[0].empty = docks[QInternal::TopDock].isEmpty();
        ver_struct_list[0].pos = docks[QInternal::TopDock].rect.top();
        ver_struct_list[0].size = docks[QInternal::TopDock].rect.height();

        // center --------------------------------------------------
        ver_struct_list[1].init();
        ver_struct_list[1].stretch = center_hint.height();

        bool tl_significant = corners[Qt::TopLeftCorner] == Qt::TopDockWidgetArea
                                    || docks[QInternal::TopDock].isEmpty();
        bool bl_significant = corners[Qt::BottomLeftCorner] == Qt::BottomDockWidgetArea
                                    || docks[QInternal::BottomDock].isEmpty();
        bool tr_significant = corners[Qt::TopRightCorner] == Qt::TopDockWidgetArea
                                    || docks[QInternal::TopDock].isEmpty();
        bool br_significant = corners[Qt::BottomRightCorner] == Qt::BottomDockWidgetArea
                                    || docks[QInternal::BottomDock].isEmpty();

        int left = (tl_significant && bl_significant) ? left_hint.height() : 0;
        int right = (tr_significant && br_significant) ? right_hint.height() : 0;
        ver_struct_list[1].sizeHint = qMax(left, center_hint.height(), right);

        left = (tl_significant && bl_significant) ? left_min.height() : 0;
        right = (tr_significant && br_significant) ? right_min.height() : 0;
        ver_struct_list[1].minimumSize = qMax(left, center_min.height(), right);
        ver_struct_list[1].maximumSize = center_max.height();
        ver_struct_list[1].expansive = have_central;
        ver_struct_list[1].empty = docks[QInternal::LeftDock].isEmpty()
                                        && !have_central
                                        && docks[QInternal::RightDock].isEmpty();
        ver_struct_list[1].pos = center_rect.top();
        ver_struct_list[1].size = center_rect.height();

        // bottom --------------------------------------------------
        ver_struct_list[2].init();
        ver_struct_list[2].stretch = 0;
        ver_struct_list[2].sizeHint = bottom_hint.height();
        ver_struct_list[2].minimumSize = bottom_min.height();
        ver_struct_list[2].maximumSize = bottom_max.height();
        ver_struct_list[2].expansive = false;
        ver_struct_list[2].empty = docks[QInternal::BottomDock].isEmpty();
        ver_struct_list[2].pos = docks[QInternal::BottomDock].rect.top();
        ver_struct_list[2].size = docks[QInternal::BottomDock].rect.height();

        for (int i = 0; i < 3; ++i) {
            ver_struct_list[i].sizeHint
                = qMax(ver_struct_list[i].sizeHint, ver_struct_list[i].minimumSize);
        }
        if (have_central && ver_struct_list[0].empty && ver_struct_list[2].empty)
            ver_struct_list[1].maximumSize = QWIDGETSIZE_MAX;
    }

    if (_hor_struct_list != nullptr) {
        QList<QLayoutStruct> &hor_struct_list = *_hor_struct_list;
        hor_struct_list.resize(3);

        // left --------------------------------------------------
        hor_struct_list[0].init();
        hor_struct_list[0].stretch = 0;
        hor_struct_list[0].sizeHint = left_hint.width();
        hor_struct_list[0].minimumSize = left_min.width();
        hor_struct_list[0].maximumSize = left_max.width();
        hor_struct_list[0].expansive = false;
        hor_struct_list[0].empty = docks[QInternal::LeftDock].isEmpty();
        hor_struct_list[0].pos = docks[QInternal::LeftDock].rect.left();
        hor_struct_list[0].size = docks[QInternal::LeftDock].rect.width();

        // center --------------------------------------------------
        hor_struct_list[1].init();
        hor_struct_list[1].stretch = center_hint.width();

        bool tl_significant = corners[Qt::TopLeftCorner] == Qt::LeftDockWidgetArea
                                    || docks[QInternal::LeftDock].isEmpty();
        bool tr_significant = corners[Qt::TopRightCorner] == Qt::RightDockWidgetArea
                                    || docks[QInternal::RightDock].isEmpty();
        bool bl_significant = corners[Qt::BottomLeftCorner] == Qt::LeftDockWidgetArea
                                    || docks[QInternal::LeftDock].isEmpty();
        bool br_significant = corners[Qt::BottomRightCorner] == Qt::RightDockWidgetArea
                                    || docks[QInternal::RightDock].isEmpty();

        int top = (tl_significant && tr_significant) ? top_hint.width() : 0;
        int bottom = (bl_significant && br_significant) ? bottom_hint.width() : 0;
        hor_struct_list[1].sizeHint = qMax(top, center_hint.width(), bottom);

        top = (tl_significant && tr_significant) ? top_min.width() : 0;
        bottom = (bl_significant && br_significant) ? bottom_min.width() : 0;
        hor_struct_list[1].minimumSize = qMax(top, center_min.width(), bottom);

        hor_struct_list[1].maximumSize = center_max.width();
        hor_struct_list[1].expansive = have_central;
        hor_struct_list[1].empty = !have_central;
        hor_struct_list[1].pos = center_rect.left();
        hor_struct_list[1].size = center_rect.width();

        // right --------------------------------------------------
        hor_struct_list[2].init();
        hor_struct_list[2].stretch = 0;
        hor_struct_list[2].sizeHint = right_hint.width();
        hor_struct_list[2].minimumSize = right_min.width();
        hor_struct_list[2].maximumSize = right_max.width();
        hor_struct_list[2].expansive = false;
        hor_struct_list[2].empty = docks[QInternal::RightDock].isEmpty();
        hor_struct_list[2].pos = docks[QInternal::RightDock].rect.left();
        hor_struct_list[2].size = docks[QInternal::RightDock].rect.width();

        for (int i = 0; i < 3; ++i) {
            hor_struct_list[i].sizeHint
                = qMax(hor_struct_list[i].sizeHint, hor_struct_list[i].minimumSize);
        }
        if (have_central && hor_struct_list[0].empty && hor_struct_list[2].empty)
            hor_struct_list[1].maximumSize = QWIDGETSIZE_MAX;

    }
}